

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Maybe<char>,_kj::Array<char>_>::TupleImpl
          (TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Maybe<char>,_kj::Array<char>_> *this,
          TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Maybe<char>,_kj::Array<char>_> *param_2)

{
  byte bVar1;
  
  bVar1 = (param_2->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.isSet;
  (this->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.isSet = (bool)bVar1;
  if ((bool)bVar1 == true) {
    (this->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.field_1 =
         (param_2->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.field_1;
    bVar1 = (param_2->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.isSet;
  }
  if ((bVar1 & 1) != 0) {
    (param_2->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.isSet = false;
  }
  (this->super_TupleElement<1U,_kj::Array<char>_>).value.ptr =
       (param_2->super_TupleElement<1U,_kj::Array<char>_>).value.ptr;
  (this->super_TupleElement<1U,_kj::Array<char>_>).value.size_ =
       (param_2->super_TupleElement<1U,_kj::Array<char>_>).value.size_;
  (this->super_TupleElement<1U,_kj::Array<char>_>).value.disposer =
       (param_2->super_TupleElement<1U,_kj::Array<char>_>).value.disposer;
  (param_2->super_TupleElement<1U,_kj::Array<char>_>).value.ptr = (char *)0x0;
  (param_2->super_TupleElement<1U,_kj::Array<char>_>).value.size_ = 0;
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }